

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall cfd::core::AdaptorSignature::AdaptorSignature(AdaptorSignature *this,ByteData *data)

{
  size_t sVar1;
  undefined8 uVar2;
  ByteData *in_stack_ffffffffffffff88;
  ByteData *in_stack_ffffffffffffff90;
  CfdError error_code;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffffb7;
  string local_48 [48];
  ByteData *local_18;
  ByteData *data_local;
  AdaptorSignature *this_local;
  
  local_18 = data;
  data_local = &this->data_;
  ByteData::ByteData(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar1 = ByteData::GetDataSize(&this->data_);
  if (sVar1 != 0x41) {
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    error_code = (CfdError)(sVar1 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,"Invalid adaptor signature data.",(allocator *)&stack0xffffffffffffffb7);
    CfdException::CfdException
              ((CfdException *)
               CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(uVar3,in_stack_ffffffffffffffb0)),
               error_code,(string *)this);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

AdaptorSignature::AdaptorSignature(const ByteData &data) : data_(data) {
  if ((data_.GetDataSize()) != AdaptorSignature::kAdaptorSignatureSize) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid adaptor signature data.");
  }
}